

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O1

void * v2i_NAME_CONSTRAINTS(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  char *__s1;
  int iVar1;
  ASN1_VALUE *val;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  ASN1_VALUE *val_00;
  GENERAL_NAME *pGVar5;
  OPENSSL_STACK *pOVar6;
  size_t sVar7;
  ASN1_VALUE *pAVar8;
  bool bVar9;
  CONF_VALUE tval;
  CONF_VALUE local_48;
  
  val = ASN1_item_new((ASN1_ITEM *)&NAME_CONSTRAINTS_it);
  if (val == (ASN1_VALUE *)0x0) {
    val_00 = (ASN1_VALUE *)0x0;
  }
  else {
    sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
    if (sVar2 == 0) {
      val_00 = (ASN1_VALUE *)0x0;
      bVar9 = false;
    }
    else {
      sVar2 = 0;
      val_00 = (ASN1_VALUE *)0x0;
      do {
        pvVar3 = OPENSSL_sk_value((OPENSSL_STACK *)nval,sVar2);
        __s1 = *(char **)((long)pvVar3 + 8);
        iVar1 = strncmp(__s1,"permitted",9);
        if (((iVar1 == 0) && (lVar4 = 10, pAVar8 = val, __s1[9] != '\0')) ||
           ((iVar1 = strncmp(__s1,"excluded",8), iVar1 == 0 &&
            (lVar4 = 9, pAVar8 = val + 8, __s1[8] != '\0')))) {
          local_48.name = __s1 + lVar4;
          local_48.value = *(char **)((long)pvVar3 + 0x10);
          val_00 = ASN1_item_new((ASN1_ITEM *)&GENERAL_SUBTREE_it);
          pGVar5 = v2i_GENERAL_NAME_ex(*(GENERAL_NAME **)val_00,(X509V3_EXT_METHOD *)method,
                                       (X509V3_CTX *)ctx,&local_48,1);
          iVar1 = 2;
          if (pGVar5 != (GENERAL_NAME *)0x0) {
            if (*(long *)pAVar8 == 0) {
              pOVar6 = OPENSSL_sk_new_null();
              *(OPENSSL_STACK **)pAVar8 = pOVar6;
            }
            if (*(OPENSSL_STACK **)pAVar8 != (OPENSSL_STACK *)0x0) {
              sVar7 = OPENSSL_sk_push(*(OPENSSL_STACK **)pAVar8,val_00);
              bVar9 = false;
              if (sVar7 != 0) {
                bVar9 = true;
                val_00 = (ASN1_VALUE *)0x0;
                iVar1 = 0;
              }
              goto LAB_00325b34;
            }
          }
          bVar9 = false;
        }
        else {
          bVar9 = false;
          ERR_put_error(0x14,0,0x87,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_ncons.cc"
                        ,0x65);
          iVar1 = 2;
        }
LAB_00325b34:
        if (!bVar9) goto LAB_00325b52;
        sVar2 = sVar2 + 1;
        sVar7 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
      } while (sVar2 < sVar7);
      iVar1 = 3;
LAB_00325b52:
      bVar9 = iVar1 == 2;
    }
    if (!bVar9) {
      return val;
    }
  }
  ASN1_item_free(val,(ASN1_ITEM *)&NAME_CONSTRAINTS_it);
  ASN1_item_free(val_00,(ASN1_ITEM *)&GENERAL_SUBTREE_it);
  return (void *)0x0;
}

Assistant:

static void *v2i_NAME_CONSTRAINTS(const X509V3_EXT_METHOD *method,
                                  const X509V3_CTX *ctx,
                                  const STACK_OF(CONF_VALUE) *nval) {
  STACK_OF(GENERAL_SUBTREE) **ptree = NULL;
  NAME_CONSTRAINTS *ncons = NULL;
  GENERAL_SUBTREE *sub = NULL;
  ncons = NAME_CONSTRAINTS_new();
  if (!ncons) {
    goto err;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(nval, i);
    CONF_VALUE tval;
    if (!strncmp(val->name, "permitted", 9) && val->name[9]) {
      ptree = &ncons->permittedSubtrees;
      tval.name = val->name + 10;
    } else if (!strncmp(val->name, "excluded", 8) && val->name[8]) {
      ptree = &ncons->excludedSubtrees;
      tval.name = val->name + 9;
    } else {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_SYNTAX);
      goto err;
    }
    tval.value = val->value;
    sub = GENERAL_SUBTREE_new();
    if (!v2i_GENERAL_NAME_ex(sub->base, method, ctx, &tval, 1)) {
      goto err;
    }
    if (!*ptree) {
      *ptree = sk_GENERAL_SUBTREE_new_null();
    }
    if (!*ptree || !sk_GENERAL_SUBTREE_push(*ptree, sub)) {
      goto err;
    }
    sub = NULL;
  }

  return ncons;

err:
  NAME_CONSTRAINTS_free(ncons);
  GENERAL_SUBTREE_free(sub);
  return NULL;
}